

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

int __thiscall re2::RepetitionWalker::ShortVisit(RepetitionWalker *this,Regexp *re,int parent_arg)

{
  LogMessageFatal LStack_188;
  
  LogMessageFatal::LogMessageFatal
            (&LStack_188,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/parse.cc",0x20a);
  std::operator<<((ostream *)&LStack_188.super_LogMessage.str_,"RepetitionWalker::ShortVisit called"
                 );
  LogMessageFatal::~LogMessageFatal(&LStack_188);
  return 0;
}

Assistant:

int RepetitionWalker::ShortVisit(Regexp* re, int parent_arg) {
  // This should never be called, since we use Walk and not
  // WalkExponential.
  LOG(DFATAL) << "RepetitionWalker::ShortVisit called";
  return 0;
}